

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IStatefulPluginInterface.h
# Opt level: O3

InterfaceId * plugin::interfaces::IStatefulPluginInterface::GetInterfaceId(void)

{
  InterfaceId *in_RDI;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"IStatefulPluginInterface","")
  ;
  InterfaceId::InterfaceId(in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

static InterfaceId GetInterfaceId()
        {
            return InterfaceId("IStatefulPluginInterface");
        }